

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

int Cut_CutFilterOld(Cut_Man_t *p,Cut_Cut_t *pList,Cut_Cut_t *pCut)

{
  int iVar1;
  Cut_Cut_t *local_58;
  Cut_Cut_t *local_50;
  Cut_Cut_t **local_48;
  Cut_Cut_t **ppTail;
  Cut_Cut_t *pTemp2;
  Cut_Cut_t *pTemp;
  Cut_Cut_t *pPrev;
  Cut_Cut_t *pCut_local;
  Cut_Cut_t *pList_local;
  Cut_Man_t *p_local;
  
  pTemp = (Cut_Cut_t *)0x0;
  for (pTemp2 = pList;
      (pTemp2 != (Cut_Cut_t *)0x0 && (*(uint *)pTemp2 >> 0x1c <= *(uint *)pCut >> 0x1c));
      pTemp2 = pTemp2->pNext) {
    pTemp = pTemp2;
    if (((pTemp2->uSign & pCut->uSign) == pTemp2->uSign) &&
       (iVar1 = Cut_CutCheckDominance(pTemp2,pCut), iVar1 != 0)) {
      p->nCutsFilter = p->nCutsFilter + 1;
      Cut_CutRecycle(p,pCut);
      return 1;
    }
  }
  if (pTemp->pNext != pTemp2) {
    __assert_fail("pPrev->pNext == pTemp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                  ,0x110,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  local_48 = &pTemp->pNext;
  if (pTemp2 == (Cut_Cut_t *)0x0) {
    local_50 = (Cut_Cut_t *)0x0;
  }
  else {
    local_50 = pTemp2->pNext;
  }
  ppTail = (Cut_Cut_t **)local_50;
  while (pTemp2 != (Cut_Cut_t *)0x0) {
    if ((pTemp2->uSign & pCut->uSign) == pCut->uSign) {
      iVar1 = Cut_CutCheckDominance(pCut,pTemp2);
      if (iVar1 == 0) {
        local_48 = &pTemp2->pNext;
      }
      else {
        p->nCutsFilter = p->nCutsFilter + 1;
        p->nNodeCuts = p->nNodeCuts + -1;
        *local_48 = pTemp2->pNext;
        Cut_CutRecycle(p,pTemp2);
      }
    }
    else {
      local_48 = &pTemp2->pNext;
    }
    pTemp2 = (Cut_Cut_t *)ppTail;
    if (ppTail == (Cut_Cut_t **)0x0) {
      local_58 = (Cut_Cut_t *)0x0;
    }
    else {
      local_58 = ppTail[2];
    }
    ppTail = (Cut_Cut_t **)local_58;
  }
  if (*local_48 == (Cut_Cut_t *)0x0) {
    return 0;
  }
  __assert_fail("*ppTail == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                ,0x129,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
}

Assistant:

static inline int Cut_CutFilterOld( Cut_Man_t * p, Cut_Cut_t * pList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pPrev, * pTemp, * pTemp2, ** ppTail;

    // check if this cut is filtered out by smaller cuts
    pPrev = NULL;
    Cut_ListForEachCut( pList, pTemp )
    {
        if ( pTemp->nLeaves > pCut->nLeaves )
            break;
        pPrev = pTemp;
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
            continue;
        // check containment seriously
        if ( Cut_CutCheckDominance( pTemp, pCut ) )
        {
            p->nCutsFilter++;
            Cut_CutRecycle( p, pCut );
            return 1;
        }
    }
    assert( pPrev->pNext == pTemp );

    // filter out other cuts using this one
    ppTail = &pPrev->pNext;
    Cut_ListForEachCutSafe( pTemp, pTemp, pTemp2 )
    {
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
        {
            ppTail = &pTemp->pNext;
            continue;
        }
        // check containment seriously
        if ( Cut_CutCheckDominance( pCut, pTemp ) )
        {
            p->nCutsFilter++;
            p->nNodeCuts--;
            // skip the given cut in the list
            *ppTail = pTemp->pNext;
            // recycle pTemp
            Cut_CutRecycle( p, pTemp );
        }
        else
            ppTail = &pTemp->pNext;
    }
    assert( *ppTail == NULL );
    return 0;
}